

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

string * __thiscall
soul::heart::Printer::PrinterStream::nameWithArray_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Identifier *name,
          optional<unsigned_int> *arraySize)

{
  string *psVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (*(char *)((long)&name->name + 4) == '\x01') {
    psVar1 = Identifier::toString_abi_cxx11_((Identifier *)this);
    std::operator+(&local_50,psVar1,'[');
    std::__cxx11::to_string(&local_70,*(uint *)&name->name);
    std::operator+(&local_30,&local_50,&local_70);
    std::operator+(__return_storage_ptr__,&local_30,']');
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    psVar1 = Identifier::toString_abi_cxx11_((Identifier *)this);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string nameWithArray (const soul::Identifier& name, const std::optional<uint32_t>& arraySize)
        {
            if (arraySize.has_value())
                return name.toString() + '[' + std::to_string (*arraySize) + ']';

            return name.toString();
        }